

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ExprBalance(Fts3Expr **pp,int nMaxDepth)

{
  u64 n;
  int iVar1;
  Fts3Expr **ppFVar2;
  int iVar3;
  int iVar4;
  void *__s;
  Fts3Expr *pFVar5;
  long lVar6;
  Fts3Expr **ppFVar7;
  ulong uVar8;
  Fts3Expr *pFVar9;
  Fts3Expr *pFVar10;
  Fts3Expr *pFVar11;
  Fts3Expr *pFVar12;
  ulong uVar13;
  bool bVar14;
  Fts3Expr *pLeft;
  Fts3Expr *pRight;
  Fts3Expr *local_60;
  Fts3Expr **local_58;
  ulong local_50;
  Fts3Expr *local_48;
  int local_3c;
  Fts3Expr *local_38;
  
  pFVar9 = *pp;
  if (nMaxDepth == 0) {
    iVar4 = 1;
  }
  else {
    iVar1 = pFVar9->eType;
    if (1 < iVar1 - 3U) {
      if (iVar1 == 2) {
        local_60 = pFVar9->pLeft;
        pFVar10 = pFVar9->pRight;
        pFVar9->pLeft = (Fts3Expr *)0x0;
        pFVar9->pRight = (Fts3Expr *)0x0;
        local_60->pParent = (Fts3Expr *)0x0;
        pFVar10->pParent = (Fts3Expr *)0x0;
        local_38 = pFVar10;
        iVar4 = fts3ExprBalance(&local_60,nMaxDepth + -1);
        if ((iVar4 == 0) &&
           (iVar4 = fts3ExprBalance(&local_38,nMaxDepth + -1), pFVar10 = local_38, iVar4 == 0)) {
          pFVar9->pLeft = local_60;
          local_60->pParent = pFVar9;
          pFVar9->pRight = local_38;
          local_38->pParent = pFVar9;
          iVar4 = 0;
        }
        else {
          sqlite3Fts3ExprFree(pFVar10);
          sqlite3Fts3ExprFree(local_60);
        }
        goto LAB_001d229d;
      }
      goto LAB_001d22ae;
    }
    iVar3 = sqlite3_initialize();
    iVar4 = 7;
    if (iVar3 == 0) {
      n = (long)nMaxDepth * 8;
      local_50 = (ulong)(uint)nMaxDepth;
      __s = sqlite3Malloc(n);
      if (__s != (void *)0x0) {
        local_58 = pp;
        memset(__s,0,n);
        iVar4 = pFVar9->eType;
        local_60 = pFVar9;
        while (iVar4 == iVar1) {
          local_60 = local_60->pLeft;
          iVar4 = local_60->eType;
        }
        local_3c = (int)local_50 + -1;
        pFVar10 = (Fts3Expr *)0x0;
        local_48 = pFVar9;
        do {
          pFVar9 = local_60->pParent;
          local_60->pParent = (Fts3Expr *)0x0;
          if (pFVar9 == (Fts3Expr *)0x0) {
            local_48 = (Fts3Expr *)0x0;
          }
          else {
            pFVar9->pLeft = (Fts3Expr *)0x0;
          }
          iVar4 = fts3ExprBalance(&local_60,local_3c);
          if (iVar4 != 0) {
LAB_001d2249:
            pFVar9 = local_48;
            ppFVar7 = local_58;
            if (0 < (int)local_50) {
              uVar8 = local_50 & 0xffffffff;
              uVar13 = 0;
              do {
                sqlite3Fts3ExprFree(*(Fts3Expr **)((long)__s + uVar13 * 8));
                uVar13 = uVar13 + 1;
                ppFVar7 = local_58;
              } while (uVar8 != uVar13);
            }
            while (ppFVar2 = local_58, pp = local_58, local_58 = ppFVar7, pFVar10 != (Fts3Expr *)0x0
                  ) {
              pFVar11 = pFVar10->pParent;
              sqlite3_free(pFVar10);
              pFVar10 = pFVar11;
              ppFVar7 = local_58;
              local_58 = ppFVar2;
            }
            goto LAB_001d2295;
          }
          bVar14 = local_60 != (Fts3Expr *)0x0;
          pFVar11 = local_60;
          if (bVar14 && 0 < (int)local_50) {
            lVar6 = 0;
            pFVar5 = local_60;
            do {
              pFVar11 = pFVar10;
              pFVar10 = *(Fts3Expr **)((long)__s + lVar6 * 8);
              if (pFVar10 == (Fts3Expr *)0x0) {
                *(Fts3Expr **)((long)__s + lVar6 * 8) = pFVar5;
                pFVar10 = pFVar11;
                goto LAB_001d20fb;
              }
              pFVar11->pLeft = pFVar10;
              pFVar11->pRight = pFVar5;
              pFVar10->pParent = pFVar11;
              pFVar5->pParent = pFVar11;
              pFVar10 = pFVar11->pParent;
              pFVar11->pParent = (Fts3Expr *)0x0;
              *(undefined8 *)((long)__s + lVar6 * 8) = 0;
              lVar6 = lVar6 + 1;
              pFVar5 = pFVar11;
            } while (lVar6 < nMaxDepth);
            bVar14 = pFVar11 != (Fts3Expr *)0x0;
          }
          if (bVar14) {
            sqlite3Fts3ExprFree(pFVar11);
            iVar4 = 0x12;
            goto LAB_001d2249;
          }
LAB_001d20fb:
          if (pFVar9 == (Fts3Expr *)0x0) goto LAB_001d21cc;
          ppFVar7 = &pFVar9->pRight;
          do {
            local_60 = *ppFVar7;
            ppFVar7 = &local_60->pLeft;
          } while (local_60->eType == iVar1);
          pFVar11 = pFVar9->pParent;
          pFVar5 = pFVar9->pRight;
          pFVar5->pParent = pFVar11;
          if (pFVar11 != (Fts3Expr *)0x0) {
            pFVar11->pLeft = pFVar5;
            pFVar5 = local_48;
          }
          local_48 = pFVar5;
          pFVar9->pParent = pFVar10;
          pFVar10 = pFVar9;
        } while( true );
      }
      iVar4 = 7;
    }
  }
  goto LAB_001d22a1;
LAB_001d21cc:
  pp = local_58;
  if ((int)local_50 < 1) {
    iVar4 = 0;
    pFVar9 = (Fts3Expr *)0x0;
  }
  else {
    uVar8 = 0;
    pFVar11 = (Fts3Expr *)0x0;
    do {
      pFVar5 = *(Fts3Expr **)((long)__s + uVar8 * 8);
      pFVar12 = pFVar10;
      pFVar9 = pFVar11;
      if (pFVar5 != (Fts3Expr *)0x0) {
        pFVar9 = pFVar5;
        if (pFVar11 != (Fts3Expr *)0x0) {
          pFVar10->pRight = pFVar11;
          pFVar9 = *(Fts3Expr **)((long)__s + uVar8 * 8);
          pFVar10->pLeft = pFVar9;
          pFVar9->pParent = pFVar10;
          pFVar11->pParent = pFVar10;
          pFVar12 = pFVar10->pParent;
          pFVar9 = pFVar10;
        }
        pFVar9->pParent = (Fts3Expr *)0x0;
      }
      uVar8 = uVar8 + 1;
      pFVar10 = pFVar12;
      pFVar11 = pFVar9;
    } while ((local_50 & 0xffffffff) != uVar8);
    iVar4 = 0;
  }
LAB_001d2295:
  sqlite3_free(__s);
LAB_001d229d:
  if (iVar4 == 0) {
LAB_001d22ae:
    iVar4 = 0;
    goto LAB_001d22b0;
  }
LAB_001d22a1:
  sqlite3Fts3ExprFree(pFVar9);
  pFVar9 = (Fts3Expr *)0x0;
LAB_001d22b0:
  *pp = pFVar9;
  return iVar4;
}

Assistant:

static int fts3ExprBalance(Fts3Expr **pp, int nMaxDepth){
  int rc = SQLITE_OK;             /* Return code */
  Fts3Expr *pRoot = *pp;          /* Initial root node */
  Fts3Expr *pFree = 0;            /* List of free nodes. Linked by pParent. */
  int eType = pRoot->eType;       /* Type of node in this tree */

  if( nMaxDepth==0 ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_OK ){
    if( (eType==FTSQUERY_AND || eType==FTSQUERY_OR) ){
      Fts3Expr **apLeaf;
      apLeaf = (Fts3Expr **)sqlite3_malloc64(sizeof(Fts3Expr *) * nMaxDepth);
      if( 0==apLeaf ){
        rc = SQLITE_NOMEM;
      }else{
        memset(apLeaf, 0, sizeof(Fts3Expr *) * nMaxDepth);
      }

      if( rc==SQLITE_OK ){
        int i;
        Fts3Expr *p;

        /* Set $p to point to the left-most leaf in the tree of eType nodes. */
        for(p=pRoot; p->eType==eType; p=p->pLeft){
          assert( p->pParent==0 || p->pParent->pLeft==p );
          assert( p->pLeft && p->pRight );
        }

        /* This loop runs once for each leaf in the tree of eType nodes. */
        while( 1 ){
          int iLvl;
          Fts3Expr *pParent = p->pParent;     /* Current parent of p */

          assert( pParent==0 || pParent->pLeft==p );
          p->pParent = 0;
          if( pParent ){
            pParent->pLeft = 0;
          }else{
            pRoot = 0;
          }
          rc = fts3ExprBalance(&p, nMaxDepth-1);
          if( rc!=SQLITE_OK ) break;

          for(iLvl=0; p && iLvl<nMaxDepth; iLvl++){
            if( apLeaf[iLvl]==0 ){
              apLeaf[iLvl] = p;
              p = 0;
            }else{
              assert( pFree );
              pFree->pLeft = apLeaf[iLvl];
              pFree->pRight = p;
              pFree->pLeft->pParent = pFree;
              pFree->pRight->pParent = pFree;

              p = pFree;
              pFree = pFree->pParent;
              p->pParent = 0;
              apLeaf[iLvl] = 0;
            }
          }
          if( p ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_TOOBIG;
            break;
          }

          /* If that was the last leaf node, break out of the loop */
          if( pParent==0 ) break;

          /* Set $p to point to the next leaf in the tree of eType nodes */
          for(p=pParent->pRight; p->eType==eType; p=p->pLeft);

          /* Remove pParent from the original tree. */
          assert( pParent->pParent==0 || pParent->pParent->pLeft==pParent );
          pParent->pRight->pParent = pParent->pParent;
          if( pParent->pParent ){
            pParent->pParent->pLeft = pParent->pRight;
          }else{
            assert( pParent==pRoot );
            pRoot = pParent->pRight;
          }

          /* Link pParent into the free node list. It will be used as an
          ** internal node of the new tree.  */
          pParent->pParent = pFree;
          pFree = pParent;
        }

        if( rc==SQLITE_OK ){
          p = 0;
          for(i=0; i<nMaxDepth; i++){
            if( apLeaf[i] ){
              if( p==0 ){
                p = apLeaf[i];
                p->pParent = 0;
              }else{
                assert( pFree!=0 );
                pFree->pRight = p;
                pFree->pLeft = apLeaf[i];
                pFree->pLeft->pParent = pFree;
                pFree->pRight->pParent = pFree;

                p = pFree;
                pFree = pFree->pParent;
                p->pParent = 0;
              }
            }
          }
          pRoot = p;
        }else{
          /* An error occurred. Delete the contents of the apLeaf[] array 
          ** and pFree list. Everything else is cleaned up by the call to
          ** sqlite3Fts3ExprFree(pRoot) below.  */
          Fts3Expr *pDel;
          for(i=0; i<nMaxDepth; i++){
            sqlite3Fts3ExprFree(apLeaf[i]);
          }
          while( (pDel=pFree)!=0 ){
            pFree = pDel->pParent;
            sqlite3_free(pDel);
          }
        }

        assert( pFree==0 );
        sqlite3_free( apLeaf );
      }
    }else if( eType==FTSQUERY_NOT ){
      Fts3Expr *pLeft = pRoot->pLeft;
      Fts3Expr *pRight = pRoot->pRight;

      pRoot->pLeft = 0;
      pRoot->pRight = 0;
      pLeft->pParent = 0;
      pRight->pParent = 0;

      rc = fts3ExprBalance(&pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprBalance(&pRight, nMaxDepth-1);
      }

      if( rc!=SQLITE_OK ){
        sqlite3Fts3ExprFree(pRight);
        sqlite3Fts3ExprFree(pLeft);
      }else{
        assert( pLeft && pRight );
        pRoot->pLeft = pLeft;
        pLeft->pParent = pRoot;
        pRoot->pRight = pRight;
        pRight->pParent = pRoot;
      }
    }
  }
  
  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRoot);
    pRoot = 0;
  }
  *pp = pRoot;
  return rc;
}